

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Basic.cpp
# Opt level: O0

void __thiscall
ObserverManager_TwoProtocolsAutoUnsubscribe_Test::~ObserverManager_TwoProtocolsAutoUnsubscribe_Test
          (ObserverManager_TwoProtocolsAutoUnsubscribe_Test *this)

{
  ObserverManager_TwoProtocolsAutoUnsubscribe_Test *this_local;
  
  ~ObserverManager_TwoProtocolsAutoUnsubscribe_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(ObserverManager, TwoProtocolsAutoUnsubscribe) {
    std::stringstream out;
    
    B* b = new B(out);
    ObserverManager::subscribe<TicTacProtocol>(b);
    ObserverManager::subscribe<FooBarProtocol>(b);
    
    delete b;
    
    ObserverManager::notify(&TicTacProtocol::ticTac);
    ObserverManager::notify(&FooBarProtocol::bar, "Toe");
    
    EXPECT_EQ("", out.str());
}